

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O2

Spectrum __thiscall CMU462::PathTracer::trace_ray(PathTracer *this,Ray *r)

{
  double dVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  float fVar7;
  Spectrum SVar8;
  float pdf;
  float dist_to_light;
  Intersection isect;
  Vector3D dir_to_light;
  Vector3D w_in;
  Vector3D w_out;
  InfiniteHemisphereLight light;
  Matrix3x3 w2o;
  Matrix3x3 o2w;
  float local_1e0;
  float local_1dc;
  double local_1d8;
  double dStack_1d0;
  Vector3D local_1c8;
  double local_1a8;
  undefined8 local_1a0;
  Vector3D VStack_198;
  long *local_180;
  Vector3D local_178;
  undefined1 local_158 [24];
  Vector3D local_140;
  undefined1 local_128 [104];
  Matrix3x3 local_c0;
  Matrix3x3 local_78;
  
  local_1a8 = INFINITY;
  local_180 = (long *)0x0;
  local_1a0 = 0;
  VStack_198.x = 0.0;
  VStack_198.y = 0.0;
  VStack_198.z = 0.0;
  iVar2 = (*(this->bvh->super_Aggregate).super_Primitive._vptr_Primitive[2])();
  uVar5 = 0;
  uVar6 = 0;
  fVar7 = 0.0;
  if ((char)iVar2 != '\0') {
    (**(code **)(*local_180 + 0x10))();
    dVar1 = (r->d).z * local_1a8 + (r->o).z;
    local_1d8 = local_1a8 * (r->d).x + (r->o).x;
    dStack_1d0 = local_1a8 * (r->d).y + (r->o).y;
    local_78.entries[2].x = 0.0;
    local_78.entries[2].y = 0.0;
    local_78.entries[1].y = 0.0;
    local_78.entries[1].z = 0.0;
    local_78.entries[0].z = 0.0;
    local_78.entries[1].x = 0.0;
    local_78.entries[0].x = 0.0;
    local_78.entries[0].y = 0.0;
    local_78.entries[2].z = 0.0;
    local_1c8.x = local_1d8;
    local_1c8.y = dStack_1d0;
    local_1c8.z = dVar1;
    make_coord_space(&local_78,&VStack_198);
    Matrix3x3::T(&local_c0,&local_78);
    local_128._16_8_ = (r->o).z - dVar1;
    dVar1 = (r->o).y - dStack_1d0;
    local_128._8_4_ = SUB84(dVar1,0);
    local_128._0_8_ = (r->o).x - local_1d8;
    local_128._12_4_ = (int)((ulong)dVar1 >> 0x20);
    Matrix3x3::operator*(&local_c0,(Vector3D *)local_128);
    Vector3D::normalize(&local_140);
    local_178.x = 2048.0004930496216;
    local_178.y = (double)CONCAT44(local_178.y._4_4_,0x40a00000);
    StaticScene::InfiniteHemisphereLight::InfiniteHemisphereLight
              ((InfiniteHemisphereLight *)local_128,(Spectrum *)&local_178);
    local_178.x = 0.0;
    local_178.y = 0.0;
    local_178.z = 0.0;
    iVar2 = (int)this->ns_area_light;
    iVar3 = 0;
    if (0 < iVar2) {
      iVar3 = iVar2;
    }
    while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
      StaticScene::InfiniteHemisphereLight::sample_L
                ((InfiniteHemisphereLight *)local_128,&local_1c8,&local_178,&local_1dc,&local_1e0);
      Matrix3x3::operator*(&local_c0,&local_178);
      (**(code **)*local_180)(local_180,&local_140,local_158);
    }
    fVar7 = 5.0;
    uVar5 = 0x40a00000;
    uVar6 = 0x40a00000;
  }
  SVar8.g = (float)uVar6;
  SVar8.r = (float)uVar5;
  SVar8.b = fVar7;
  return SVar8;
}

Assistant:

Spectrum PathTracer::trace_ray(const Ray &r) {

    Intersection isect;

    if (!bvh->intersect(r, &isect)) {

      // log ray miss
#ifdef ENABLE_RAY_LOGGING
      log_ray_miss(r);
#endif

      // TODO:
      // If you have an environment map, return the Spectrum this ray
      // samples from the environment map. If you don't return black.

      return Spectrum(0,0,0);
    }

    // log ray hit
#ifdef ENABLE_RAY_LOGGING
    log_ray_hit(r, isect.t);
#endif

    Spectrum L_out = isect.bsdf->get_emission(); // Le

    // TODO :
    // Instead of initializing this value to a constant color, use the direct,
    // indirect lighting components calculated in the code below. The starter
    // code overwrites L_out by (.5,.5,.5) so that you can test your geometry
    // queries before you implement path tracing.
    L_out = Spectrum(5.f, 5.f, 5.f);

    Vector3D hit_p = r.o + r.d * isect.t;
    Vector3D hit_n = isect.n;

    // make a coordinate system for a hit point
    // with N aligned with the Z direction.
    Matrix3x3 o2w;
    make_coord_space(o2w, isect.n);
    Matrix3x3 w2o = o2w.T();

    // w_out points towards the source of the ray (e.g.,
    // toward the camera if this is a primary ray)
    Vector3D w_out = w2o * (r.o - hit_p);
    w_out.normalize();

    // TODO:
    // Extend the below code to compute the direct lighting for all the lights
    // in the scene, instead of just the dummy light we provided in part 1.

    InfiniteHemisphereLight light(Spectrum(5.f, 5.f, 5.f));
    //DirectionalLight light(Spectrum(5.f, 5.f, 5.f), Vector3D(1.0, -1.0, 0.0));

    Vector3D dir_to_light;
    float dist_to_light;
    float pdf;

    // no need to take multiple samples from a directional source
    int num_light_samples = light.is_delta_light() ? 1 : ns_area_light;

    // integrate light over the hemisphere about the normal
    double scale = 1.0 / num_light_samples;
    for (int i=0; i<num_light_samples; i++) {

      // returns a vector 'dir_to_light' that is a direction from
      // point hit_p to the point on the light source.  It also returns
      // the distance from point x to this point on the light source.
      // (pdf is the probability of randomly selecting the random
      // sample point on the light source -- more on this in part 2)
      Spectrum light_L = light.sample_L(hit_p, &dir_to_light, &dist_to_light, &pdf);

      // convert direction into coordinate space of the surface, where
      // the surface normal is [0 0 1]
      Vector3D w_in = w2o * dir_to_light;

      // note that computing dot(n,w_in) is simple
      // in surface coordinates since the normal is [0 0 1]
      double cos_theta = std::max(0.0, w_in[2]);

      // evaluate surface bsdf
      Spectrum f = isect.bsdf->f(w_out, w_in);

      // TODO:
      // Construct a shadow ray and compute whether the intersected surface is
      // in shadow and accumulate reflected radiance
    }

    // TODO:
    // Compute an indirect lighting estimate using pathtracing with Monte Carlo.
    // Note that Ray objects have a depth field now; you should use this to avoid
    // traveling down one path forever.

    return L_out;
  }